

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

void adiak_register_cb(int adiak_version,int category,adiak_nameval_cb_t nv,int report_on_all_ranks,
                      void *opaque_val)

{
  void *opaque_val_local;
  int report_on_all_ranks_local;
  adiak_nameval_cb_t nv_local;
  int category_local;
  int adiak_version_local;
  
  adiak_register(adiak_version,category,nv,report_on_all_ranks,opaque_val);
  return;
}

Assistant:

void adiak_register_cb(int adiak_version, int category,
                       adiak_nameval_cb_t nv, int report_on_all_ranks, void *opaque_val)
{
   adiak_register(adiak_version, category, nv, report_on_all_ranks, opaque_val);
}